

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O1

size_t write_lab(MIR_context_t ctx,writer_func_t writer,MIR_label_t lab)

{
  size_t *psVar1;
  reduce_data *data;
  bool bVar2;
  ulong uVar3;
  uint8_t uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  
  if (writer == (writer_func_t)0x0) {
    sVar8 = 0;
  }
  else {
    uVar6 = lab->ops[0].u.u;
    uVar7 = 0;
    uVar3 = uVar6;
    if (0x7f < uVar6) {
      do {
        uVar7 = uVar7 + 1;
        bVar2 = 0xff < uVar3;
        uVar3 = uVar3 >> 8;
      } while (bVar2);
    }
    if (4 < uVar7) {
      __assert_fail("nb <= 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                    ,0x12db,"size_t write_lab(MIR_context_t, writer_func_t, MIR_label_t)");
    }
    uVar7 = uVar7 + (uVar7 == 0);
    uVar4 = (char)uVar7 + '\x1f';
    data = ctx->io_ctx->io_reduce_data;
    uVar5 = data->buf_bound;
    if ((ulong)uVar5 < 0x40000) {
      data->buf_bound = uVar5 + 1;
      data->buf[uVar5] = uVar4;
    }
    else {
      _reduce_encode_buf(data);
      data->buf_bound = 1;
      data->buf[0] = uVar4;
    }
    uVar3 = uVar7 & 0xffffffff;
    do {
      put_byte(ctx,writer,(uint)uVar6 & 0xff);
      uVar6 = uVar6 >> 8;
      uVar5 = (int)uVar3 - 1;
      uVar3 = (ulong)uVar5;
    } while (uVar5 != 0);
    sVar8 = uVar7 + 1;
    psVar1 = &ctx->io_ctx->output_labs_len;
    *psVar1 = *psVar1 + sVar8;
  }
  return sVar8;
}

Assistant:

static size_t write_lab (MIR_context_t ctx, writer_func_t writer, MIR_label_t lab) {
  size_t nb, len;
  uint64_t lab_num;

  if (writer == NULL) return 0;
  lab_num = lab->ops[0].u.u;
  nb = uint_length (lab_num);
  mir_assert (nb <= 4);
  if (nb == 0) nb = 1;
  put_byte (ctx, writer, TAG_LAB1 + (int) nb - 1);
  len = put_uint (ctx, writer, lab_num, (int) nb) + 1;
  output_labs_len += len;
  return len;
}